

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O3

void __thiscall Scine::Core::ModuleManager::Impl::Impl(Impl *this)

{
  _func_int **pp_Var1;
  _Alloc_hider _Var2;
  error_category *peVar3;
  Impl *this_00;
  pointer pbVar4;
  int iVar5;
  char *__s;
  size_t sVar6;
  pointer pbVar7;
  bool bVar8;
  string modulePath;
  path coreLocationParent;
  path executableParentPath;
  string local_f8;
  undefined1 *local_d8;
  error_category *local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  undefined1 *local_b8;
  error_category *local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  Impl *local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  path local_78;
  path local_58;
  int local_38;
  
  (this->_sources).
  super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_sources).
  super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_sources).
  super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98 = this;
  boost::dll::program_location();
  boost::filesystem::path::parent_path();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  tryLoadModulesInPath(this,&local_58);
  tryAdjacentDirectories(this,&local_58);
  local_d8 = &local_c8;
  local_d0 = (error_category *)0x0;
  local_c8 = 0;
  local_b0 = (error_category *)0x0;
  local_a8 = 0;
  local_90.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_90.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start._5_3_ << 0x28);
  local_90.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)&boost::system::detail::cat_holder<void>::system_category_instance;
  local_b8 = &local_a8;
  iVar5 = dladdr(boost::dll::anon_unknown_3::this_line_location);
  peVar3 = local_b0;
  _Var2._M_p = local_f8._M_dataplus._M_p;
  if (iVar5 == 0) {
    dlerror();
    local_90.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x10000000e;
    local_90.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)&boost::system::detail::cat_holder<void>::generic_category_instance;
  }
  else {
    strlen(local_f8._M_dataplus._M_p);
    std::__cxx11::string::_M_replace((ulong)&local_b8,0,(char *)peVar3,(ulong)_Var2._M_p);
  }
  std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_b8);
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
  }
  this_00 = local_98;
  if (iVar5 == 0) {
    boost::dll::detail::report_error
              ((error_code *)&local_90,"boost::dll::this_line_location() failed");
  }
  boost::filesystem::path::parent_path();
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
  }
  tryLoadModulesInPath(this_00,&local_78);
  boost::filesystem::path::parent_path();
  boost::filesystem::path::parent_path();
  iVar5 = boost::filesystem::path::compare((path *)&local_f8);
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (iVar5 != 0) {
    tryAdjacentDirectories(this_00,&local_78);
  }
  __s = getenv("SCINE_MODULE_PATH");
  if (__s != (char *)0x0) {
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    sVar6 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,__s,__s + sVar6);
    Detail::split(&local_90,&local_f8,':');
    pbVar4 = local_90.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_90.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_90.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar7 = local_90.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (pbVar7->_M_string_length != 0) {
          pp_Var1 = ((error_category *)&pbVar7->_M_dataplus)->_vptr_error_category;
          local_b8 = &local_a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,pp_Var1,pbVar7->_M_string_length + (long)pp_Var1);
          boost::filesystem::detail::status((path *)&local_d8,(error_code *)&local_b8);
          if ((uint)local_d8 < 2) {
            bVar8 = false;
          }
          else {
            local_d8 = &local_c8;
            pp_Var1 = ((error_category *)&pbVar7->_M_dataplus)->_vptr_error_category;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d8,pp_Var1,pbVar7->_M_string_length + (long)pp_Var1);
            boost::filesystem::detail::status((path *)&local_38,(error_code *)&local_d8);
            bVar8 = local_38 == 3;
            if (local_d8 != &local_c8) {
              operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
            }
          }
          if (local_b8 != &local_a8) {
            operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
          }
          if (bVar8) {
            pp_Var1 = ((error_category *)&pbVar7->_M_dataplus)->_vptr_error_category;
            local_b8 = &local_a8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b8,pp_Var1,pbVar7->_M_string_length + (long)pp_Var1);
            tryLoadModulesInPath(local_98,(path *)&local_b8);
            if (local_b8 != &local_a8) {
              operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
            }
          }
        }
        pbVar7 = pbVar7 + 1;
      } while (pbVar7 != pbVar4);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.m_pathname._M_dataplus._M_p != &local_78.m_pathname.field_2) {
    operator_delete(local_78.m_pathname._M_dataplus._M_p,
                    local_78.m_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.m_pathname._M_dataplus._M_p != &local_58.m_pathname.field_2) {
    operator_delete(local_58.m_pathname._M_dataplus._M_p,
                    local_58.m_pathname.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Impl() {
    /* Try to load modules in several paths: */
    const auto executableParentPath = boost::dll::program_location().parent_path();
    tryLoadModulesInPath(executableParentPath);
    tryAdjacentDirectories(executableParentPath);
    const auto coreLocationParent = boost::dll::this_line_location().parent_path();
    tryLoadModulesInPath(coreLocationParent);
    if (coreLocationParent.parent_path() != executableParentPath.parent_path()) {
      tryAdjacentDirectories(coreLocationParent);
    }

    // SCINE_MODULE_PATH environment variable. Path separators are os-dependent!
#ifdef _WIN32
    const char pathSep = ';';
#else
    const char pathSep = ':';
#endif

    if (const char* pathPtr = std::getenv("SCINE_MODULE_PATH")) {
      std::string modulePath = pathPtr;

      for (const auto& singlePath : Detail::split(modulePath, pathSep)) {
        if (!singlePath.empty() && boost::filesystem::exists(singlePath) && boost::filesystem::is_directory(singlePath)) {
          tryLoadModulesInPath(singlePath);
        }
      }
    }
  }